

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void check_ly_eq_lyc(Emulator *e,Bool write)

{
  Bool write_local;
  Emulator *e_local;
  
  if (((e->state).ppu.ly == (e->state).ppu.lyc) ||
     (((write != FALSE && ((e->state).ppu.last_ly == 0x99)) &&
      ((e->state).ppu.last_ly == (e->state).ppu.lyc)))) {
    (e->state).ppu.stat.y_compare.trigger = TRUE;
    (e->state).ppu.stat.new_ly_eq_lyc = TRUE;
  }
  else {
    (e->state).ppu.stat.y_compare.trigger = FALSE;
    (e->state).ppu.stat.new_ly_eq_lyc = FALSE;
    (e->state).ppu.stat.ly_eq_lyc = FALSE;
    if ((((((write != FALSE) &&
           ((((e->state).interrupt.new_if ^ (e->state).interrupt.if_) & (e->state).interrupt.new_if
            & 2) != 0)) &&
          (((e->state).ppu.stat.trigger_mode != PPU_MODE_HBLANK ||
           ((e->state).ppu.stat.hblank.irq == FALSE)))) &&
         (((e->state).ppu.stat.trigger_mode != PPU_MODE_VBLANK ||
          ((e->state).ppu.stat.vblank.irq == FALSE)))) &&
        (((e->state).ppu.stat.mode2.trigger == FALSE || ((e->state).ppu.stat.mode2.irq == FALSE))))
       && (((e->state).ppu.stat.y_compare.trigger == FALSE ||
           ((e->state).ppu.stat.y_compare.irq == FALSE)))) {
      (e->state).interrupt.new_if = (e->state).interrupt.new_if & 0xfd;
    }
  }
  return;
}

Assistant:

static void check_ly_eq_lyc(Emulator* e, Bool write) {
  if (PPU.ly == PPU.lyc ||
      (write && PPU.last_ly == SCREEN_HEIGHT_WITH_VBLANK - 1 &&
       PPU.last_ly == PPU.lyc)) {
    HOOK(trigger_y_compare_ii, PPU.ly, TICKS + CPU_TICK);
    STAT.y_compare.trigger = TRUE;
    STAT.new_ly_eq_lyc = TRUE;
  } else {
    STAT.y_compare.trigger = FALSE;
    STAT.ly_eq_lyc = STAT.new_ly_eq_lyc = FALSE;
    if (write) {
      /* If stat was triggered this frame due to Y compare, cancel it.
       * There's probably a nicer way to do this. */
      if ((INTR.new_if ^ INTR.if_) & INTR.new_if & IF_STAT) {
        if (!SHOULD_TRIGGER_STAT) {
          INTR.new_if &= ~IF_STAT;
        }
      }
    }
  }
}